

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool AddLocal(CService *addr_,int nScore)

{
  bool bVar1;
  uint16_t uVar2;
  Network net;
  _Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> _Var3;
  long in_FS_OFFSET;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool> pVar4;
  string_view logging_function;
  LocalServiceInfo local_70;
  int nScore_local;
  UniqueLock<GlobalMutex> criticalblock19;
  undefined1 local_50 [16];
  CService local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  nScore_local = nScore;
  MaybeFlipIPv6toCJDNS(&local_40,addr_);
  bVar1 = CNetAddr::IsRoutable(&local_40.super_CNetAddr);
  if ((bVar1) && ((3 < nScore || (fDiscover != false)))) {
    net = CNetAddr::GetNetwork(&local_40.super_CNetAddr);
    bVar1 = ReachableNets::Contains(&g_reachable_nets,net);
    if (bVar1) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&criticalblock19,&local_40);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "AddLocal";
      logging_function._M_len = 8;
      LogPrintFormatInternal<std::__cxx11::string,int>
                (logging_function,source_file,0x119,ALL,Info,(ConstevalFormatString<2U>)0xf790cc,
                 (string *)&criticalblock19,&nScore_local);
      if (criticalblock19.super_unique_lock._M_device != (mutex_type *)local_50) {
        operator_delete(criticalblock19.super_unique_lock._M_device,local_50._0_8_ + 1);
      }
      criticalblock19.super_unique_lock._M_device = (mutex_type *)&g_maplocalhost_mutex;
      criticalblock19.super_unique_lock._M_owns = false;
      std::unique_lock<std::mutex>::lock(&criticalblock19.super_unique_lock);
      local_70.nScore = 0;
      local_70.nPort = 0;
      local_70._6_2_ = 0;
      pVar4 = std::
              _Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
              ::_M_emplace_unique<CService&,LocalServiceInfo>
                        ((_Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
                          *)&mapLocalHost,&local_40,&local_70);
      _Var3 = pVar4.first._M_node;
      if ((((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         ((int)_Var3._M_node[2]._M_color <= nScore_local)) {
        _Var3._M_node[2]._M_color = nScore_local + (uint)(byte)(pVar4.second ^ 1);
        uVar2 = CService::GetPort(&local_40);
        *(uint16_t *)&_Var3._M_node[2].field_0x4 = uVar2;
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock19.super_unique_lock);
      bVar1 = true;
      goto LAB_008b5476;
    }
  }
  bVar1 = false;
LAB_008b5476:
  if (0x10 < local_40.super_CNetAddr.m_addr._size) {
    free(local_40.super_CNetAddr.m_addr._union.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CService& addr_, int nScore)
{
    CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    if (!addr.IsRoutable())
        return false;

    if (!fDiscover && nScore < LOCAL_MANUAL)
        return false;

    if (!g_reachable_nets.Contains(addr))
        return false;

    LogPrintf("AddLocal(%s,%i)\n", addr.ToStringAddrPort(), nScore);

    {
        LOCK(g_maplocalhost_mutex);
        const auto [it, is_newly_added] = mapLocalHost.emplace(addr, LocalServiceInfo());
        LocalServiceInfo &info = it->second;
        if (is_newly_added || nScore >= info.nScore) {
            info.nScore = nScore + (is_newly_added ? 0 : 1);
            info.nPort = addr.GetPort();
        }
    }

    return true;
}